

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDVertex::ClearFaceMarks(ON_SubDVertex *this)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar1 = this->m_face_count;
  if (uVar1 == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    uVar3 = 0;
    do {
      if (this->m_faces[uVar3] == (ON_SubDFace *)0x0) {
        bVar2 = false;
      }
      else {
        ON_ComponentStatus::ClearRuntimeMark
                  (&(this->m_faces[uVar3]->super_ON_SubDComponentBase).m_status);
        uVar1 = this->m_face_count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
  }
  return bVar2;
}

Assistant:

bool ON_SubDVertex::ClearFaceMarks() const
{
  bool rc = true;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr == f)
      rc = false;
    else
      f->m_status.ClearRuntimeMark();
  }
  return rc;
}